

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlstring.c
# Opt level: O3

err_t ReadData(ebml_master *Element,stream *Input,ebml_parser_context *ParserContext,
              bool_t AllowDummyElt,int Scope,size_t DepthCheckCRC)

{
  int iVar1;
  code *pcVar2;
  bool bVar3;
  stream *psVar4;
  size_t sVar5;
  filepos_t fVar6;
  long lVar7;
  ebml_crc *Element_00;
  bool_t bVar8;
  filepos_t fVar9;
  long lVar10;
  ebml_context *Context_00;
  stream *psVar11;
  ebml_crc *peVar12;
  int iVar13;
  bool bVar14;
  int UpperEltFound;
  uint8_t *CRCData;
  filepos_t OffSet;
  ebml_parser_context Context;
  int local_ac;
  stream *local_a8;
  int local_9c;
  char *local_98;
  stream *local_90;
  size_t local_88;
  ebml_crc *local_80;
  array local_78;
  long local_68;
  size_t local_60;
  long local_58;
  ebml_parser_context local_50;
  
  local_ac = 0;
  local_98 = (char *)0x0;
  local_9c = Scope;
  local_60 = DepthCheckCRC;
  NodeTree_Clear((nodetree *)Element);
  (Element->Base).bValueIsSet = '\0';
  if (((Element->Base).DataSize < 1) &&
     (bVar8 = EBML_ElementIsFiniteSize(&Element->Base), bVar8 != 0)) {
    (Element->Base).bValueIsSet = '\x01';
    if (0 < local_ac) {
LAB_0011bc1d:
      __assert_fail("SubElement!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                    ,0x1a0,
                    "err_t ReadData(ebml_master *, struct stream *, const ebml_parser_context *, bool_t, int, size_t)"
                   );
    }
  }
  else {
    if (Input == (stream *)0x0) {
      __assert_fail("(const void*)(Input)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                    ,0x123,
                    "err_t ReadData(ebml_master *, struct stream *, const ebml_parser_context *, bool_t, int, size_t)"
                   );
    }
    pcVar2 = *(code **)((long)(Input->Base).VMT + 0x78);
    fVar6 = EBML_ElementPositionData(&Element->Base);
    lVar7 = (*pcVar2)(Input,fVar6,0);
    if (lVar7 == -1) {
      return -9;
    }
    lVar7 = (Element->Base).DataSize;
    local_50.Context = (Element->Base).Context;
    local_50.UpContext = ParserContext;
    local_50.EndPosition = EBML_ElementPositionEnd(&Element->Base);
    local_50.Profile = ParserContext->Profile;
    local_90 = Input;
    Element_00 = (ebml_crc *)EBML_FindNextElement(Input,&local_50,&local_ac,AllowDummyElt);
    local_80 = (ebml_crc *)0x0;
    if ((Element_00 != (ebml_crc *)0x0) && (local_ac < 1)) {
      local_88 = 0;
      local_58 = local_60 - 1;
      if (local_60 == 0) {
        local_58 = 0;
      }
      bVar3 = true;
      local_a8 = local_90;
      local_80 = (ebml_crc *)0x0;
      iVar13 = local_9c;
      do {
        bVar8 = EBML_ElementIsFiniteSize(&Element->Base);
        if (bVar8 != 0) {
          fVar6 = EBML_ElementPositionEnd(&Element_00->Base);
          fVar9 = EBML_ElementPositionEnd(&Element->Base);
          iVar13 = local_9c;
          if (fVar9 < fVar6) goto LAB_0011bb64;
        }
        if ((AllowDummyElt == 0) && (bVar8 = EBML_ElementIsDummy(&Element_00->Base), bVar8 != 0)) {
          EBML_ElementSkipData(&Element_00->Base,local_a8,&local_50,(ebml_element *)0x0,0);
LAB_0011b8fe:
          NodeDelete((node *)Element_00);
          Element_00 = (ebml_crc *)0x0;
        }
        else {
          lVar10 = (**(code **)((long)(Element_00->Base).Base.Base.VMT + 0x78))
                             (Element_00,local_a8,&local_50,AllowDummyElt,iVar13,local_58);
          peVar12 = local_80;
          if (lVar10 != 0) goto LAB_0011b8fe;
          if (((iVar13 == 2) || (local_60 == 0)) || (!bVar3)) {
LAB_0011b916:
            if (peVar12 != Element_00) {
              EBML_MasterAppend(Element,&Element_00->Base);
            }
          }
          else {
            Context_00 = EBML_getContextEbmlCrc32();
            bVar8 = EBML_ElementIsType(&Element_00->Base,Context_00);
            bVar3 = true;
            if ((bVar8 == 0) || (peVar12 != (ebml_crc *)0x0)) goto LAB_0011b916;
            bVar8 = EBML_ElementIsFiniteSize(&Element->Base);
            psVar11 = local_90;
            if (bVar8 == 0) {
              peVar12 = (ebml_crc *)0x0;
LAB_0011b914:
              bVar3 = false;
              goto LAB_0011b916;
            }
            bVar8 = Node_IsPartOf(local_90,0x534d454d);
            peVar12 = Element_00;
            if (bVar8 == 0) {
              local_78._Begin = (char *)0x0;
              local_78._Used = 0;
              fVar6 = EBML_ElementPositionEnd(&Element->Base);
              fVar9 = EBML_ElementPositionEnd(&Element_00->Base);
              if (fVar6 - fVar9 == 0xffffffffffffffff) goto LAB_0011b8d1;
              bVar8 = ArrayResize(&local_78,fVar6 - fVar9,0);
              sVar5 = local_78._Used;
              bVar3 = false;
              if (bVar8 != 0) {
                local_98 = local_78._Begin;
                psVar11 = (stream *)NodeCreate(Element,0x534d454d);
                local_88 = sVar5;
                if (psVar11 != (stream *)0x0) {
                  local_68 = EBML_ElementPositionEnd(&Element_00->Base);
                  (**(code **)((long)(psVar11->Base).VMT + 0x20))(psVar11,0x100,local_98,sVar5);
                  (**(code **)((long)(psVar11->Base).VMT + 0x20))(psVar11,0x102,&local_68);
                  psVar4 = local_90;
                  pcVar2 = *(code **)((long)(local_90->Base).VMT + 0x78);
                  local_a8 = psVar11;
                  fVar6 = EBML_ElementPositionEnd(&Element_00->Base);
                  (*pcVar2)(psVar4,fVar6,0);
                  lVar7 = (**(code **)((long)(psVar4->Base).VMT + 0x58))(psVar4,local_98,sVar5);
                  iVar13 = local_9c;
                  if (lVar7 != 0) {
                    StreamClose(local_a8);
                    ArrayClear(&local_78);
                    local_98 = (char *)0x0;
                    local_a8 = psVar4;
                    peVar12 = (ebml_crc *)0x0;
                    iVar13 = local_9c;
                  }
                  goto LAB_0011b914;
                }
                ArrayClear(&local_78);
                local_a8 = local_90;
                goto LAB_0011b8d1;
              }
            }
            else {
              pcVar2 = *(code **)((long)(psVar11->Base).VMT + 0x78);
              fVar6 = EBML_ElementPositionEnd(&Element_00->Base);
              lVar7 = (*pcVar2)(psVar11,fVar6,0);
              (**(code **)((long)(psVar11->Base).VMT + 0x18))(psVar11,0x102,&local_68,8);
              (**(code **)((long)(psVar11->Base).VMT + 0x18))(psVar11,0x101,&local_98);
              iVar13 = local_9c;
              local_98 = local_98 + (lVar7 - local_68);
              fVar6 = EBML_ElementDataSize(&Element->Base,1);
              fVar9 = EBML_ElementFullSize(&Element_00->Base,1);
              local_88 = fVar6 - fVar9;
              (**(code **)((long)(psVar11->Base).VMT + 0x58))(psVar11,local_98,local_88);
LAB_0011b8d1:
              bVar3 = false;
            }
          }
          local_80 = peVar12;
          EBML_ElementSkipData
                    (&Element_00->Base,local_a8,&local_50,(ebml_element *)0x0,AllowDummyElt);
          fVar6 = EBML_ElementPositionEnd(&Element->Base);
          fVar9 = EBML_ElementPositionEnd(&Element_00->Base);
          lVar7 = fVar6 - fVar9;
        }
        if (local_ac < 1) {
          if (((local_ac < 0) && (local_ac = local_ac + 1, local_ac != 0)) ||
             ((bVar8 = EBML_ElementIsFiniteSize(&Element->Base), bVar8 != 0 && (lVar7 < 1))))
          goto LAB_0011bb64;
          Element_00 = (ebml_crc *)EBML_FindNextElement(local_a8,&local_50,&local_ac,AllowDummyElt);
        }
        else {
          iVar1 = local_ac + -1;
          bVar14 = local_ac != 1;
          local_ac = iVar1;
          if ((bVar14) ||
             ((bVar8 = EBML_ElementIsFiniteSize(&Element->Base), bVar8 != 0 && (lVar7 < 1))))
          goto LAB_0011bb64;
        }
        if ((Element_00 == (ebml_crc *)0x0) || (0 < local_ac)) goto LAB_0011bb64;
      } while( true );
    }
    local_a8 = local_90;
    local_88 = 0;
LAB_0011bb64:
    peVar12 = local_80;
    if (local_98 != (char *)0x0) {
      bVar8 = EBML_CRCMatches(local_80,local_98,local_88);
      Element->CheckSumStatus = 2 - (uint)(bVar8 == 0);
      NodeDelete((node *)peVar12);
      if (local_98 == local_78._Begin) {
        StreamClose(local_a8);
        ArrayClear(&local_78);
      }
    }
    (Element->Base).bValueIsSet = '\x01';
    if (0 < local_ac) {
      if (Element_00 != (ebml_crc *)0x0) {
        (**(code **)((long)(local_90->Base).VMT + 0x78))
                  (local_90,(Element_00->Base).ElementPosition,0);
        NodeDelete((node *)Element_00);
        return 0;
      }
      goto LAB_0011bc1d;
    }
  }
  return 0;
}

Assistant:

static err_t ReadData(ebml_string *Element, struct stream *Input, const ebml_parser_context *UNUSED_PARAM(ParserContext), bool_t UNUSED_PARAM(AllowDummyElt), int Scope, size_t UNUSED_PARAM(DepthCheckCRC))
{
    err_t Result;
    char *Buffer = NULL;

    Element->Base.bValueIsSet = 0;

    if (Scope == SCOPE_NO_DATA)
        return ERR_NONE;

    if (Stream_Seek(Input,EBML_ElementPositionData((ebml_element*)Element),SEEK_SET)==INVALID_FILEPOS_T)
    {
        Result = ERR_READ;
        goto failed;
    }
#if MAX_FILEPOS >= SIZE_MAX
    if ((filepos_t)Element->Base.DataSize > (filepos_t)(SIZE_MAX - 1))
#else
    if ((size_t)Element->Base.DataSize > (size_t)(SIZE_MAX - 1))
#endif
    {
        Result = ERR_OUT_OF_MEMORY;
        goto failed;
    }

    Buffer = malloc((size_t)Element->Base.DataSize+1);
    if (!Buffer)
        return ERR_OUT_OF_MEMORY;

    Result = Stream_Read(Input,Buffer,(size_t)Element->Base.DataSize,NULL);
    if (Result != ERR_NONE)
        goto failed;

    Buffer[Element->Base.DataSize] = 0;
    Element->Buffer = Buffer;
    Element->Base.bValueIsSet = 1;
    return ERR_NONE;

failed:
    free(Buffer);
    Element->Buffer = NULL;
    return Result;
}